

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

_Bool wait_for_work(lzma_stream_coder_conflict1 *coder,mythread_condtime *wait_abs,
                   _Bool *has_blocked,_Bool has_input)

{
  bool bVar1;
  _Bool _Var2;
  byte bVar3;
  int iVar4;
  _Bool _Var5;
  uint mythread_j_639;
  uint mythread_i_639;
  _Bool timed_out;
  _Bool has_input_local;
  _Bool *has_blocked_local;
  mythread_condtime *wait_abs_local;
  lzma_stream_coder_conflict1 *coder_local;
  
  if ((coder->timeout != 0) && ((*has_blocked & 1U) == 0)) {
    *has_blocked = true;
    mythread_condtime_set(wait_abs,&coder->cond,coder->timeout);
  }
  _Var5 = false;
  bVar1 = false;
  do {
    if (bVar1) {
      mythread_mutex_unlock(&coder->mutex);
      return _Var5;
    }
    mythread_mutex_lock(&coder->mutex);
    bVar1 = false;
    while (!bVar1) {
LAB_0021973d:
      if ((has_input) && (coder->threads_free != (worker_thread *)0x0)) {
        _Var2 = lzma_outq_has_buf(&coder->outq);
        bVar3 = 0;
        if (!_Var2) goto LAB_0021976d;
      }
      else {
LAB_0021976d:
        _Var2 = lzma_outq_is_readable(&coder->outq);
        bVar3 = 0;
        if ((!_Var2) && (bVar3 = 0, coder->thread_error == LZMA_OK)) {
          bVar3 = _Var5 ^ 1;
        }
      }
      if (bVar3 != 0) {
        if (coder->timeout == 0) {
          mythread_cond_wait(&coder->cond,&coder->mutex);
        }
        else {
          iVar4 = mythread_cond_timedwait(&coder->cond,&coder->mutex,wait_abs);
          _Var5 = iVar4 != 0;
        }
        goto LAB_0021973d;
      }
      bVar1 = true;
    }
    bVar1 = true;
  } while( true );
}

Assistant:

static bool
wait_for_work(lzma_stream_coder *coder, mythread_condtime *wait_abs,
		bool *has_blocked, bool has_input)
{
	if (coder->timeout != 0 && !*has_blocked) {
		// Every time when stream_encode_mt() is called via
		// lzma_code(), *has_blocked starts as false. We set it
		// to true here and calculate the absolute time when
		// we must return if there's nothing to do.
		//
		// The idea of *has_blocked is to avoid unneeded calls
		// to mythread_condtime_set(), which may do a syscall
		// depending on the operating system.
		*has_blocked = true;
		mythread_condtime_set(wait_abs, &coder->cond, coder->timeout);
	}

	bool timed_out = false;

	mythread_sync(coder->mutex) {
		// There are four things that we wait. If one of them
		// becomes possible, we return.
		//  - If there is input left, we need to get a free
		//    worker thread and an output buffer for it.
		//  - Data ready to be read from the output queue.
		//  - A worker thread indicates an error.
		//  - Time out occurs.
		while ((!has_input || coder->threads_free == NULL
					|| !lzma_outq_has_buf(&coder->outq))
				&& !lzma_outq_is_readable(&coder->outq)
				&& coder->thread_error == LZMA_OK
				&& !timed_out) {
			if (coder->timeout != 0)
				timed_out = mythread_cond_timedwait(
						&coder->cond, &coder->mutex,
						wait_abs) != 0;
			else
				mythread_cond_wait(&coder->cond,
						&coder->mutex);
		}
	}

	return timed_out;
}